

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astWhileContinueWithNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_32_4_1fe0574e gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.analyzedBodyExpression = 0;
  gcFrame.analyzedContinueExpression = 0;
  gcFrame.whileNode = (sysbvm_astWhileContinueWithNode_t *)0x0;
  gcFrame.analyzedConditionExpression = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 4;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  gcFrame.whileNode =
       (sysbvm_astWhileContinueWithNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.whileNode)->super).analyzerToken = sVar2;
  ((gcFrame.whileNode)->super).analyzedType = (context->roots).voidType;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.whileNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  if ((gcFrame.whileNode)->conditionExpression != 0) {
    gcFrame.analyzedConditionExpression =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,(gcFrame.whileNode)->conditionExpression,(context->roots).booleanType,
                    arguments[1]);
    (gcFrame.whileNode)->conditionExpression = gcFrame.analyzedConditionExpression;
  }
  if ((gcFrame.whileNode)->bodyExpression != 0) {
    gcFrame.analyzedBodyExpression =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,(gcFrame.whileNode)->bodyExpression,(context->roots).voidType,
                    arguments[1]);
    (gcFrame.whileNode)->bodyExpression = gcFrame.analyzedBodyExpression;
  }
  if ((gcFrame.whileNode)->continueExpression != 0) {
    gcFrame.analyzedContinueExpression =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,(gcFrame.whileNode)->continueExpression,(context->roots).voidType,
                    arguments[1]);
    (gcFrame.whileNode)->continueExpression = gcFrame.analyzedContinueExpression;
  }
  if ((((gcFrame.whileNode)->conditionExpression != 0) &&
      (_Var1 = sysbvm_astNode_isLiteralNode(context,(gcFrame.whileNode)->conditionExpression), _Var1
      )) && (sVar2 = sysbvm_astLiteralNode_getValue((gcFrame.whileNode)->conditionExpression),
            sVar2 != 0x1f)) {
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_38);
    sVar2 = sysbvm_astLiteralNode_create(context,((gcFrame.whileNode)->super).sourcePosition,0x2f);
    return sVar2;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_38);
  return (sysbvm_tuple_t)gcFrame.whileNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astWhileContinueWithNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astWhileContinueWithNode_t *whileNode;
        sysbvm_tuple_t analyzedConditionExpression;
        sysbvm_tuple_t analyzedBodyExpression;
        sysbvm_tuple_t analyzedContinueExpression;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.whileNode = (sysbvm_astWhileContinueWithNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.whileNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    gcFrame.whileNode->super.analyzedType = context->roots.voidType;

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.whileNode->super.sourcePosition);
    
    if(gcFrame.whileNode->conditionExpression)
    {
        gcFrame.analyzedConditionExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.whileNode->conditionExpression, context->roots.booleanType, *environment);
        gcFrame.whileNode->conditionExpression = gcFrame.analyzedConditionExpression;
    }

    if(gcFrame.whileNode->bodyExpression)
    {
        gcFrame.analyzedBodyExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.whileNode->bodyExpression, context->roots.voidType, *environment);
        gcFrame.whileNode->bodyExpression = gcFrame.analyzedBodyExpression;
    }

    if(gcFrame.whileNode->continueExpression)
    {
        gcFrame.analyzedContinueExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.whileNode->continueExpression, context->roots.voidType, *environment);
        gcFrame.whileNode->continueExpression = gcFrame.analyzedContinueExpression;
    }
    
    // Optimize out the loop if the condition is the literal false.
    if(gcFrame.whileNode->conditionExpression &&
        sysbvm_astNode_isLiteralNode(context, gcFrame.whileNode->conditionExpression) &&
        !sysbvm_tuple_boolean_decode(sysbvm_astLiteralNode_getValue(gcFrame.whileNode->conditionExpression)))
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_astLiteralNode_create(context, gcFrame.whileNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.whileNode;
}